

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests::expectCreateWindow(SDLGraphicsSystemTests *this)

{
  int iVar1;
  WrapperMock *this_00;
  TypedExpectation<int_(unsigned_int)> *this_01;
  ActionInterface<int_(unsigned_int)> *impl;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_02;
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  *this_03;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *x;
  unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> *x_00;
  MockSpec<int_(unsigned_int)> local_120;
  _Any_data local_100;
  code *local_f0;
  int *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  MatcherBase<unsigned_int> local_d0;
  unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> local_b8;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_90;
  unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> local_68;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_40;
  
  this_00 = &((this->sdlMock).rawPointer)->super_WrapperMock;
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_d0,0x20);
  SDL::WrapperMock::gmock_init(&local_120,this_00,(Matcher<unsigned_int> *)&local_d0);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<int_(unsigned_int)>::InternalExpectedAt
                      (&local_120,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x68,"*sdlMock","init(0x00000020u)");
  local_e0 = (int *)operator_new(4);
  *local_e0 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_d8,local_e0);
  impl = (ActionInterface<int_(unsigned_int)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00329638;
  iVar1 = *local_e0;
  *(int *)&impl[1]._vptr_ActionInterface = iVar1;
  *(int *)((long)&impl[1]._vptr_ActionInterface + 4) = iVar1;
  testing::Action<int_(unsigned_int)>::Action((Action<int_(unsigned_int)> *)&local_100,impl);
  testing::internal::TypedExpectation<int_(unsigned_int)>::WillOnce
            (this_01,(Action<int_(unsigned_int)> *)&local_100);
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_120.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_d0);
  this_02 = expectSDLCreateWindow
                      (this,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  makeSDLWindow((UniquePtr<SDL_Window> *)&local_40,this,(SDL_Window_conflict *)0x1);
  testing::ByMove<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
            ((ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
             &local_90,(testing *)&local_40,x);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>>
            ((testing *)local_100._M_pod_data,
             (ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
             &local_90);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
              *)&local_120,(ReturnAction *)local_100._M_pod_data);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::WillOnce(this_02,(Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
                      *)&local_120);
  if (local_120.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>.
      super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
      super_MatcherBase<unsigned_int>.vtable_ != (VTable *)0x0) {
    (*(code *)local_120.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>.
              super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
              super_MatcherBase<unsigned_int>.vtable_)(&local_120,&local_120,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
  }
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_90);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_40);
  this_03 = expectSDLCreateRenderer(this,(SDL_Window_conflict *)0x1);
  makeSDLRenderer((UniquePtr<SDL_Renderer> *)&local_68,this,(SDL_Renderer_conflict *)0x2);
  testing::ByMove<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>>
            ((ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_> *
             )&local_b8,(testing *)&local_68,x_00);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>>>
            ((testing *)local_100._M_pod_data,
             (ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_> *
             )&local_b8);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
              *)&local_120,(ReturnAction *)local_100._M_pod_data);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  ::WillOnce(this_03,(Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
                      *)&local_120);
  if (local_120.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>.
      super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
      super_MatcherBase<unsigned_int>.vtable_ != (VTable *)0x0) {
    (*(code *)local_120.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>.
              super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
              super_MatcherBase<unsigned_int>.vtable_)(&local_120,&local_120,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
  }
  std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::~unique_ptr(&local_b8);
  std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::~unique_ptr(&local_68);
  SDLGraphicsSystem::createWindow
            (&this->system,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  return;
}

Assistant:

void expectCreateWindow() {
        EXPECT_CALL(*sdlMock, init(SDL_INIT_VIDEO)).WillOnce(Return(success));
        expectSDLCreateWindow(title, windowWidth, windowHeight)
            .WillOnce(Return(ByMove(makeSDLWindow(windowPtr))));
        expectSDLCreateRenderer(windowPtr)
            .WillOnce(Return(ByMove(makeSDLRenderer(rendererPtr))));
        system.createWindow(title, windowWidth, windowHeight);
    }